

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  LayerUnion LVar7;
  undefined8 *puVar8;
  long *plVar9;
  uint uVar10;
  size_type *psVar11;
  ulong *puVar12;
  long *plVar13;
  ulong uVar14;
  pointer pcVar15;
  uint uVar16;
  string err;
  string __str;
  string local_140;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  string *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  pointer *local_90;
  long local_88;
  pointer local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_120,layer,1,1);
  __return_storage_ptr__->m_type = local_120._0_4_;
  __return_storage_ptr__->m_reason = local_120._4_4_;
  local_f8 = (string *)&__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=(local_f8,(string *)&local_118);
  pcVar15 = local_110 + 8;
  if (local_118._M_p != pcVar15) {
    operator_delete(local_118._M_p,local_110._8_8_ + 1);
  }
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    validateOutputCount((Result *)local_120,layer,1,1);
    __return_storage_ptr__->m_type = local_120._0_4_;
    __return_storage_ptr__->m_reason = local_120._4_4_;
    std::__cxx11::string::operator=(local_f8,(string *)&local_118);
    if (local_118._M_p != pcVar15) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
  }
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Upsample","");
    validateInputOutputRankEquality((Result *)local_120,layer,&local_70,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_120._0_4_;
    __return_storage_ptr__->m_reason = local_120._4_4_;
    std::__cxx11::string::operator=(local_f8,(string *)&local_118);
    if (local_118._M_p != pcVar15) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Upsample","");
    validateRankCount((Result *)local_120,layer,&local_140,3,-1,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_120._0_4_;
    __return_storage_ptr__->m_reason = local_120._4_4_;
    std::__cxx11::string::operator=(local_f8,(string *)&local_118);
    if (local_118._M_p != pcVar15) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0xd2) {
    LVar7 = layer->layer_;
  }
  else {
    LVar7.upsample_ = Specification::UpsampleLayerParams::default_instance();
  }
  iVar6 = ((LVar7.convolution_)->kernelsize_).current_size_;
  iVar1 = ((LVar7.convolution_)->stride_).current_size_;
  if (iVar6 == 0) {
    iVar6 = iVar1;
    if (iVar1 != 0) goto LAB_002cc7cd;
LAB_002cc7d6:
    if ((((LVar7.convolution_)->stride_).current_size_ == 2) &&
       (((LVar7.pooling_)->type_ == 0 ||
        (((LVar7.convolution_)->dilationfactor_).current_size_ == 0)))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "Invalid upsample layer \'",(layer->name_).ptr_);
      puVar8 = (undefined8 *)std::__cxx11::string::append(local_120);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140.field_2._8_8_ = puVar8[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_140._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if (local_120 != (undefined1  [8])local_110) {
        operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
      }
      Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&local_140);
    }
    else {
      if (((LVar7.convolution_)->dilationfactor_).current_size_ == 0) {
        return __return_storage_ptr__;
      }
      if ((LVar7.pooling_)->type_ != 0) {
        return __return_storage_ptr__;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "Layer \'",(layer->name_).ptr_);
      puVar8 = (undefined8 *)std::__cxx11::string::append(local_120);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140.field_2._8_8_ = puVar8[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_140._M_string_length = puVar8[1];
      *puVar8 = psVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if (local_120 != (undefined1  [8])local_110) {
        operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
      }
      Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&local_140);
    }
    __return_storage_ptr__->m_type = local_120._0_4_;
    __return_storage_ptr__->m_reason = local_120._4_4_;
    std::__cxx11::string::operator=(local_f8,(string *)&local_118);
    if (local_118._M_p != pcVar15) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002ccd47;
  }
  if (iVar1 == 0) {
LAB_002cc7cd:
    if (iVar6 == 2) goto LAB_002cc7d6;
  }
  std::operator+(&local_50,"Invalid scaling factor in upsampling layer \'",(layer->name_).ptr_);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = &local_c0;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_c0 = *puVar12;
    lStack_b8 = plVar9[3];
  }
  else {
    local_c0 = *puVar12;
    local_d0 = (ulong *)*plVar9;
  }
  local_c8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = ((LVar7.convolution_)->kernelsize_).current_size_;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar16 = 1;
  if (9 < uVar3) {
    uVar14 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar16 = uVar4;
      uVar10 = (uint)uVar14;
      if (uVar10 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_002cc99d;
      }
      if (uVar10 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_002cc99d;
      }
      if (uVar10 < 10000) goto LAB_002cc99d;
      uVar14 = uVar14 / 10000;
      uVar4 = uVar16 + 4;
    } while (99999 < uVar10);
    uVar16 = uVar16 + 1;
  }
LAB_002cc99d:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_f0),uVar16,uVar3);
  uVar14 = 0xf;
  if (local_d0 != &local_c0) {
    uVar14 = local_c0;
  }
  if (uVar14 < (ulong)(local_e8 + local_c8)) {
    uVar14 = 0xf;
    if (local_f0 != local_e0) {
      uVar14 = local_e0[0];
    }
    if (uVar14 < (ulong)(local_e8 + local_c8)) goto LAB_002cca1f;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_002cca1f:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
  }
  local_b0 = &local_a0;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_a0 = *plVar9;
    uStack_98 = puVar8[3];
  }
  else {
    local_a0 = *plVar9;
    local_b0 = (long *)*puVar8;
  }
  local_a8 = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_110._0_8_ = *plVar13;
    local_110._8_8_ = plVar9[3];
    local_120 = (undefined1  [8])local_110;
  }
  else {
    local_110._0_8_ = *plVar13;
    local_120 = (undefined1  [8])*plVar9;
  }
  local_118._M_p = (pointer)plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = ((LVar7.convolution_)->stride_).current_size_;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar16 = 1;
  if (9 < uVar3) {
    uVar14 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar16 = uVar4;
      uVar10 = (uint)uVar14;
      if (uVar10 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_002ccb51;
      }
      if (uVar10 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_002ccb51;
      }
      if (uVar10 < 10000) goto LAB_002ccb51;
      uVar14 = uVar14 / 10000;
      uVar4 = uVar16 + 4;
    } while (99999 < uVar10);
    uVar16 = uVar16 + 1;
  }
LAB_002ccb51:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_90),uVar16,uVar3);
  pcVar15 = (pointer)0xf;
  if (local_120 != (undefined1  [8])local_110) {
    pcVar15 = (pointer)local_110._0_8_;
  }
  if (pcVar15 < local_118._M_p + local_88) {
    pcVar15 = (pointer)0xf;
    if (local_90 != local_80) {
      pcVar15 = local_80[0];
    }
    if (pcVar15 < local_118._M_p + local_88) goto LAB_002ccbd7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_002ccbd7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_120,(ulong)local_90);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_140.field_2._M_allocated_capacity = *psVar11;
    local_140.field_2._8_8_ = puVar8[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar11;
    local_140._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_140._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if (local_90 != local_80) {
    operator_delete(local_90,(ulong)(local_80[0] + 1));
  }
  if (local_120 != (undefined1  [8])local_110) {
    operator_delete((void *)local_120,(ulong)(local_110._0_8_ + 1));
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&local_140);
  __return_storage_ptr__->m_type = local_120._0_4_;
  __return_storage_ptr__->m_reason = local_120._4_4_;
  std::__cxx11::string::operator=(local_f8,(string *)&local_118);
  if (local_118._M_p != local_110 + 8) {
    operator_delete(local_118._M_p,local_110._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p == &local_140.field_2) {
    return __return_storage_ptr__;
  }
LAB_002ccd47:
  operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Upsample", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Upsample", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}